

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionMonitor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_240b81::RegionMonitor::finish_cb
          (RegionMonitor *this,Caliper *param_1,Channel *channel)

{
  ostream *poVar1;
  size_type sVar2;
  string local_258;
  Log local_228;
  Channel *local_20;
  Channel *channel_local;
  Caliper *param_1_local;
  RegionMonitor *this_local;
  
  local_20 = channel;
  channel_local = (Channel *)param_1;
  param_1_local = (Caliper *)this;
  cali::Log::Log(&local_228,1);
  poVar1 = cali::Log::stream(&local_228);
  cali::Channel::name_abi_cxx11_(&local_258,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_258);
  poVar1 = std::operator<<(poVar1,": ");
  sVar2 = std::
          unordered_map<unsigned_long,_(anonymous_namespace)::RegionMonitor::RegionInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::RegionMonitor::RegionInfo>_>_>
          ::size(&this->m_tracking_regions);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," regions marked, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_num_measured);
  poVar1 = std::operator<<(poVar1," instances measured.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_258);
  cali::Log::~Log(&local_228);
  return;
}

Assistant:

void finish_cb(Caliper*, Channel* channel)
    {
        Log(1).stream() << channel->name() << ": " << m_tracking_regions.size() << " regions marked, " << m_num_measured
                        << " instances measured." << std::endl;
    }